

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

int __thiscall despot::TabularCPT::ComputeIndex(TabularCPT *this,int pid,double *sum)

{
  pointer pvVar1;
  pointer ppVar2;
  pointer pvVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  pvVar1 = (this->sparse_values_).
           super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->sparse_values_).
      super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    ppVar2 = pvVar1[pid].
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)pvVar1[pid].
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
    if (lVar7 != 0) {
      dVar10 = *sum;
      lVar7 = lVar7 >> 4;
      lVar7 = lVar7 + (ulong)(lVar7 == 0);
      pdVar5 = &ppVar2->second;
      do {
        dVar9 = *pdVar5;
        if (dVar10 < dVar9) {
          *sum = dVar10 / (dVar9 * 1.000000001);
          return ((pair<int,_double> *)(pdVar5 + -1))->first;
        }
        dVar10 = dVar10 - dVar9;
        *sum = dVar10;
        pdVar5 = pdVar5 + 2;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    return -1;
  }
  pvVar3 = (this->super_CPT).super_Function.values_.
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar5 = pvVar3[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)*(pointer *)
                 ((long)&pvVar3[pid].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + 8) - (long)pdVar5;
  bVar8 = lVar7 != 0;
  if (bVar8) {
    uVar6 = lVar7 >> 3;
    dVar10 = *sum;
    dVar9 = *pdVar5;
    uVar4 = 0;
    if (dVar9 <= dVar10) {
      uVar4 = 0;
      do {
        dVar10 = dVar10 - dVar9;
        *sum = dVar10;
        if ((uVar6 + (uVar6 == 0)) - 1 == uVar4) goto LAB_00147f41;
        dVar9 = pdVar5[uVar4 + 1];
        uVar4 = uVar4 + 1;
      } while (dVar9 <= dVar10);
      bVar8 = uVar4 < uVar6;
    }
    *sum = dVar10 / (dVar9 * 1.000000001);
    if (bVar8) {
      return (int)uVar4;
    }
  }
LAB_00147f41:
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/parser/function.cpp"
                ,0x16d,"virtual int despot::TabularCPT::ComputeIndex(int, double &) const");
}

Assistant:

int TabularCPT::ComputeIndex(int pid, double& sum) const {
	if (sparse_values_.size() != 0) {
		for (int i = 0; i < sparse_values_[pid].size(); i++) {
			const pair<int, double>& pair = sparse_values_[pid][i];
			if (sum < pair.second) {
				sum /= pair.second * (1 + 1E-9);
				return pair.first;
			}
			sum -= pair.second;
		}
		return -1;
	} else {
		for (int cur = 0; cur < values_[pid].size(); cur++) {
			if (sum < values_[pid][cur]) {
				sum /= values_[pid][cur] * (1 + 1E-9);
				return cur;
			}
			sum -= values_[pid][cur];
		}
	}

	assert(false);
	return -1;
}